

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall QPDF::closeInputSource(QPDF *this)

{
  InvalidInputSource *__p;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __p = (InvalidInputSource *)operator_new(0xa8);
  memset(__p,0,0xa8);
  (__p->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__InputSource_002ae930;
  std::shared_ptr<InputSource>::shared_ptr<(anonymous_namespace)::InvalidInputSource,void>
            ((shared_ptr<InputSource> *)&_Stack_28,__p);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void
QPDF::closeInputSource()
{
    m->file = std::shared_ptr<InputSource>(new InvalidInputSource());
}